

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

MODSTRUCT * LOADGetPalLibrary(void)

{
  int iVar1;
  errno_t eVar2;
  char *local_28;
  Dl_info info;
  
  if (pal_module == (MODSTRUCT *)0x0) {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    iVar1 = dladdr(LOADGetPalLibrary,&local_28);
    if (iVar1 == 0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      dlerror();
    }
    else if ((g_szCoreCLRPath == (char *)0x0) &&
            (g_szCoreCLRPath = (char *)CorUnix::InternalMalloc(g_cbszCoreCLRPath),
            g_szCoreCLRPath == (char *)0x0)) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
    }
    else {
      eVar2 = strcpy_s(g_szCoreCLRPath,g_cbszCoreCLRPath,local_28);
      if (eVar2 == 0) {
        pal_module = (MODSTRUCT *)LOADLoadLibrary(local_28,0);
      }
      else if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
    }
  }
  return pal_module;
}

Assistant:

MODSTRUCT *LOADGetPalLibrary()
{
    if (pal_module == nullptr)
    {
        // Initialize the pal module (the module containing LOADGetPalLibrary). Assumes that
        // the PAL is linked into the coreclr module because we use the module name containing
        // this function for the coreclr path.
        TRACE("Loading module for PAL library\n");

        Dl_info info;
        if (dladdr((PVOID)&LOADGetPalLibrary, &info) == 0)
        {
            ERROR("LOADGetPalLibrary: dladdr() failed. dlerror message is \"%s\"\n", dlerror());
            goto exit;
        }
        // Stash a copy of the CoreCLR installation path in a global variable.
        // Make sure it's terminated with a slash.
        if (g_szCoreCLRPath == nullptr)
        {
            g_szCoreCLRPath = (char*) InternalMalloc(g_cbszCoreCLRPath);

            if (g_szCoreCLRPath == nullptr)
            {
                ERROR("LOADGetPalLibrary: InternalMalloc failed!");
                goto exit;
            }
        }

        if (strcpy_s(g_szCoreCLRPath, g_cbszCoreCLRPath, info.dli_fname) != SAFECRT_SUCCESS)
        {
            ERROR("LOADGetPalLibrary: strcpy_s failed!");
            goto exit;
        }
        pal_module = (MODSTRUCT *)LOADLoadLibrary(info.dli_fname, FALSE);
    }

exit:
    return pal_module;
}